

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleTimeZone::SimpleTimeZone
          (SimpleTimeZone *this,int32_t rawOffsetGMT,UnicodeString *ID,int8_t savingsStartMonth,
          int8_t savingsStartDay,int8_t savingsStartDayOfWeek,int32_t savingsStartTime,
          int8_t savingsEndMonth,int8_t savingsEndDay,int8_t savingsEndDayOfWeek,
          int32_t savingsEndTime,UErrorCode *status)

{
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,ID);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleTimeZone_003a3a60;
  this->transitionRulesInitialized = '\0';
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTransition = (TimeZoneTransition *)0x0;
  this->stdRule = (AnnualTimeZoneRule *)0x0;
  this->dstRule = (AnnualTimeZoneRule *)0x0;
  this->rawOffset = rawOffsetGMT;
  this->startMonth = savingsStartMonth;
  this->startDay = savingsStartDay;
  this->startDayOfWeek = savingsStartDayOfWeek;
  this->startTime = savingsStartTime;
  this->startTimeMode = WALL_TIME;
  this->endTimeMode = WALL_TIME;
  this->endMonth = savingsEndMonth;
  this->endDay = savingsEndDay;
  this->endDayOfWeek = savingsEndDayOfWeek;
  this->endTime = savingsEndTime;
  this->dstSavings = 3600000;
  this->startYear = 0;
  this->startMode = DOM_MODE;
  this->endMode = DOM_MODE;
  decodeStartRule(this,status);
  decodeEndRule(this,status);
  return;
}

Assistant:

SimpleTimeZone::SimpleTimeZone(int32_t rawOffsetGMT, const UnicodeString& ID,
    int8_t savingsStartMonth, int8_t savingsStartDay,
    int8_t savingsStartDayOfWeek, int32_t savingsStartTime,
    int8_t savingsEndMonth, int8_t savingsEndDay,
    int8_t savingsEndDayOfWeek, int32_t savingsEndTime,
    UErrorCode& status)
:   BasicTimeZone(ID)
{
    clearTransitionRules();
    construct(rawOffsetGMT,
              savingsStartMonth, savingsStartDay, savingsStartDayOfWeek,
              savingsStartTime, WALL_TIME,
              savingsEndMonth, savingsEndDay, savingsEndDayOfWeek,
              savingsEndTime, WALL_TIME,
              U_MILLIS_PER_HOUR, status);
}